

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

size_type __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
::internal_verify(btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *this,node_type *node,key_type *lo,key_type *hi)

{
  field_type fVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  key_type *pkVar5;
  key_type *y;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar6;
  size_type sVar7;
  key_type *local_a0;
  key_type *local_88;
  uint local_3c;
  ulong uStack_38;
  int i_1;
  size_type count;
  int i;
  key_type *hi_local;
  key_type *lo_local;
  node_type *node_local;
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *this_local;
  
  fVar1 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::count(node);
  if (fVar1 == '\0') {
    __assert_fail("node->count() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xca3,
                  "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  bVar2 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::count(node);
  bVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::max_count(node);
  if (bVar3 < bVar2) {
    __assert_fail("node->count() <= node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xca4,
                  "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  if (lo != (key_type *)0x0) {
    pkVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             ::key(node,0);
    bVar4 = btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
            ::compare_keys<int,int>
                      ((btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                        *)this,pkVar5,lo);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      __assert_fail("!compare_keys(node->key(0), *lo)",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xca6,
                    "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                   );
    }
  }
  if (hi != (key_type *)0x0) {
    bVar2 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::count(node);
    pkVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             ::key(node,(long)(int)(bVar2 - 1));
    bVar4 = btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
            ::compare_keys<int,int>
                      ((btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                        *)this,hi,pkVar5);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      __assert_fail("!compare_keys(*hi, node->key(node->count() - 1))",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xca9,
                    "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                   );
    }
  }
  for (count._4_4_ = 1;
      bVar2 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::count(node), count._4_4_ < (int)(uint)bVar2; count._4_4_ = count._4_4_ + 1) {
    pkVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             ::key(node,(long)count._4_4_);
    y = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        ::key(node,(long)(count._4_4_ + -1));
    bVar4 = btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
            ::compare_keys<int,int>
                      ((btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                        *)this,pkVar5,y);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      __assert_fail("!compare_keys(node->key(i), node->key(i - 1))",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xcac,
                    "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                   );
    }
  }
  bVar2 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::count(node);
  uStack_38 = (ulong)bVar2;
  bVar4 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::leaf(node);
  if (!bVar4) {
    for (local_3c = 0;
        bVar2 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::count(node), (int)local_3c <= (int)(uint)bVar2; local_3c = local_3c + 1) {
      pbVar6 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child(node,(long)(int)local_3c);
      if (pbVar6 == (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     *)0x0) {
        __assert_fail("node->child(i) != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcb1,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      pbVar6 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child(node,(long)(int)local_3c);
      pbVar6 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::parent(pbVar6);
      if (pbVar6 != node) {
        __assert_fail("node->child(i)->parent() == node",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcb2,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      pbVar6 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child(node,(long)(int)local_3c);
      bVar2 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::position(pbVar6);
      if (bVar2 != local_3c) {
        __assert_fail("node->child(i)->position() == i",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcb3,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      pbVar6 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child(node,(long)(int)local_3c);
      local_88 = lo;
      if (local_3c != 0) {
        local_88 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   ::key(node,(long)(int)(local_3c - 1));
      }
      bVar2 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::count(node);
      local_a0 = hi;
      if (local_3c != bVar2) {
        local_a0 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   ::key(node,(long)(int)local_3c);
      }
      sVar7 = internal_verify(this,pbVar6,local_88,local_a0);
      uStack_38 = sVar7 + uStack_38;
    }
  }
  return uStack_38;
}

Assistant:

typename btree<P>::size_type btree<P>::internal_verify(
        const node_type *node, const key_type *lo, const key_type *hi) const {
        assert(node->count() > 0);
        assert(node->count() <= node->max_count());
        if (lo) {
            assert(!compare_keys(node->key(0), *lo));
        }
        if (hi) {
            assert(!compare_keys(*hi, node->key(node->count() - 1)));
        }
        for (int i = 1; i < node->count(); ++i) {
            assert(!compare_keys(node->key(i), node->key(i - 1)));
        }
        size_type count = node->count();
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                assert(node->child(i) != nullptr);
                assert(node->child(i)->parent() == node);
                assert(node->child(i)->position() == i);
                count += internal_verify(
                    node->child(i),
                    (i == 0) ? lo : &node->key(i - 1),
                    (i == node->count()) ? hi : &node->key(i));
            }
        }
        return count;
    }